

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

size_t c4::yml::anon_unknown_0::_count_resolved_tags_size(Tree *t,size_t node)

{
  size_t sVar1;
  NodeData *pNVar2;
  csubstr *pcVar3;
  size_t sVar4;
  Tree *in_RSI;
  Tree *in_RDI;
  bool bVar5;
  size_t child;
  size_t sz;
  size_t in_stack_00000520;
  Tree *in_stack_00000528;
  csubstr in_stack_00000530;
  substr in_stack_00000540;
  size_t in_stack_ffffffffffffff18;
  Tree *in_stack_ffffffffffffff20;
  basic_substring<char> local_b0;
  char *local_a0;
  size_t in_stack_ffffffffffffff68;
  Tree *in_stack_ffffffffffffff70;
  Tree *in_stack_ffffffffffffff78;
  Tree *this;
  
  this = (Tree *)0x0;
  sVar1 = Tree::first_child(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  while (sVar1 != 0xffffffffffffffff) {
    pNVar2 = Tree::_p(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    if ((((pNVar2->m_type).type & KEY) != NOTYPE) &&
       (pNVar2 = Tree::_p(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68),
       ((pNVar2->m_type).type & (KEYTAG|KEY)) == (KEYTAG|KEY))) {
      basic_substring<char>::basic_substring((basic_substring<char> *)&stack0xffffffffffffff70);
      pcVar3 = Tree::key_tag(in_stack_ffffffffffffff78,(size_t)in_stack_ffffffffffffff70);
      local_a0 = pcVar3->str;
      in_stack_ffffffffffffff68 = pcVar3->len;
      sVar4 = Tree::resolve_tag(in_stack_00000528,in_stack_00000540,in_stack_00000530,
                                in_stack_00000520);
      this = (Tree *)((long)this->m_tag_directives + (sVar4 - 0x60));
    }
    pNVar2 = Tree::_p(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    if (((pNVar2->m_type).type & VAL) != NOTYPE) {
      pNVar2 = Tree::_p(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      bVar5 = false;
      if (((pNVar2->m_type).type & VALTAG) != NOTYPE) {
        bVar5 = ((pNVar2->m_type).type & (SEQ|MAP|VAL)) != NOTYPE;
      }
      if (bVar5) {
        in_stack_ffffffffffffff20 = in_RDI;
        basic_substring<char>::basic_substring(&local_b0);
        Tree::val_tag(this,sVar1);
        sVar1 = Tree::resolve_tag(in_stack_00000528,in_stack_00000540,in_stack_00000530,
                                  in_stack_00000520);
        this = (Tree *)((long)this->m_tag_directives + (sVar1 - 0x60));
      }
    }
    sVar1 = _count_resolved_tags_size(in_RSI,(size_t)this);
    this = (Tree *)((long)this->m_tag_directives + (sVar1 - 0x60));
    sVar1 = Tree::next_sibling(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  }
  return (size_t)this;
}

Assistant:

size_t _count_resolved_tags_size(Tree const* t, size_t node)
{
    size_t sz = 0;
    for(size_t child = t->first_child(node); child != NONE; child = t->next_sibling(child))
    {
        if(t->has_key(child) && t->has_key_tag(child))
            sz += t->resolve_tag(substr{}, t->key_tag(child), child);
        if(t->has_val(child) && t->has_val_tag(child))
            sz += t->resolve_tag(substr{}, t->val_tag(child), child);
        sz += _count_resolved_tags_size(t, child);
    }
    return sz;
}